

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

Model * gvr::loadSTL(char *name,bool merge_double_vertices)

{
  float *pfVar1;
  uint *puVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Mesh *this;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  ulong local_520;
  undefined1 local_518 [8];
  double dStack_510;
  double local_508;
  Vector6d pose;
  string sheader;
  Vector3d Tc;
  char header [81];
  Matrix33d Rc;
  istringstream in_1;
  undefined4 local_3b0 [2];
  undefined8 local_3a8;
  undefined4 *local_3a0;
  undefined4 *local_398;
  undefined8 local_390;
  ifstream in;
  
  std::ifstream::ifstream(&in);
  std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
  std::ifstream::open((char *)&in,(_Ios_Openmode)name);
  gmath::SMatrix<double,_3,_3>::SMatrix(&Rc);
  gmath::SVector<double,_3>::SVector(&Tc);
  std::istream::read((char *)&in,(long)header);
  header[0x50] = '\0';
  std::__cxx11::string::string((string *)&sheader,header,(allocator *)&in_1);
  iVar3 = std::__cxx11::string::compare((ulong)&sheader,0,(char *)0x8);
  if (iVar3 == 0) {
    std::__cxx11::string::substr((ulong)local_518,(ulong)&sheader);
    std::__cxx11::istringstream::istringstream((istringstream *)&in_1,(string *)local_518,_S_in);
    std::__cxx11::string::~string((string *)local_518);
    gmath::SVector<double,_6>::SVector(&pose);
    gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)&in_1,&pose);
    bVar11 = *(int *)((long)&local_398 + *(long *)(_in_1 + -0x18)) == 0;
    if (bVar11) {
      gmath::getRotation((Matrix33d *)local_518,&pose);
      gmath::SMatrix<double,_3,_3>::operator=(&Rc,(SMatrix<double,_3,_3> *)local_518);
      local_518 = (undefined1  [8])CONCAT44(pose.v[0]._4_4_,pose.v[0]._0_4_);
      dStack_510 = pose.v[1];
      local_508 = pose.v[2];
      gmath::SVector<double,_3>::operator=(&Tc,(SVector<double,_3> *)local_518);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&in_1);
  }
  else {
    bVar11 = false;
  }
  std::__cxx11::string::~string((string *)&sheader);
  uVar4 = anon_unknown_1::stlReadUint32(&in);
  local_520 = (ulong)uVar4;
  this = (Mesh *)operator_new(0xc0);
  Mesh::Mesh(this);
  if (bVar11) {
    Model::setDefCameraRT((Model *)this,&Rc,&Tc);
  }
  (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,(ulong)(uVar4 * 3),0,0);
  (*(this->super_PointCloud).super_Model._vptr_Model[10])(this,local_520);
  local_3a0 = local_3b0;
  local_3b0[0] = 0;
  local_3a8 = 0;
  local_390 = 0;
  pose.v[0]._0_4_ = 0;
  iVar3 = 0;
  local_398 = local_3a0;
  while( true ) {
    iVar5 = (int)local_520;
    local_520 = (ulong)(iVar5 - 1);
    if (iVar5 == 0) break;
    anon_unknown_1::stlReadVector3f((anon_unknown_1 *)header,&in);
    uVar6 = pose.v[0]._0_4_;
    if (merge_double_vertices) {
      anon_unknown_1::stlReadVector3f((anon_unknown_1 *)local_518,&in);
      uVar6 = anon_unknown_1::findOrStoreVertex
                        (this,(set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                               *)&in_1,(int *)&pose,(Vector3f *)local_518,(Vector3f *)header);
      anon_unknown_1::stlReadVector3f((anon_unknown_1 *)local_518,&in);
      uVar7 = anon_unknown_1::findOrStoreVertex
                        (this,(set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                               *)&in_1,(int *)&pose,(Vector3f *)local_518,(Vector3f *)header);
      uVar8 = (ulong)uVar7;
      anon_unknown_1::stlReadVector3f((anon_unknown_1 *)local_518,&in);
      uVar7 = anon_unknown_1::findOrStoreVertex
                        (this,(set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                               *)&in_1,(int *)&pose,(Vector3f *)local_518,(Vector3f *)header);
      uVar10 = (ulong)uVar7;
    }
    else {
      pose.v[0]._0_4_ = pose.v[0]._0_4_ + 3;
      anon_unknown_1::stlReadVector3f((anon_unknown_1 *)local_518,&in);
      lVar9 = (long)(int)uVar6;
      pfVar1 = (this->super_PointCloud).vertex;
      pfVar1[lVar9 * 3] = (float)local_518._0_4_;
      pfVar1[lVar9 * 3 + 1] = (float)local_518._4_4_;
      pfVar1[lVar9 * 3 + 2] = dStack_510._0_4_;
      anon_unknown_1::stlReadVector3f((anon_unknown_1 *)local_518,&in);
      uVar8 = lVar9 + 1;
      pfVar1 = (this->super_PointCloud).vertex;
      pfVar1[uVar8 * 3] = (float)local_518._0_4_;
      pfVar1[uVar8 * 3 + 1] = (float)local_518._4_4_;
      pfVar1[uVar8 * 3 + 2] = dStack_510._0_4_;
      anon_unknown_1::stlReadVector3f((anon_unknown_1 *)local_518,&in);
      uVar10 = lVar9 + 2;
      pfVar1 = (this->super_PointCloud).vertex;
      pfVar1[uVar10 * 3] = (float)local_518._0_4_;
      pfVar1[uVar10 * 3 + 1] = (float)local_518._4_4_;
      pfVar1[uVar10 * 3 + 2] = dStack_510._0_4_;
    }
    puVar2 = this->triangle;
    puVar2[iVar3] = uVar6;
    puVar2[(long)iVar3 + 1] = (uint)uVar8;
    puVar2[(long)iVar3 + 2] = (uint)uVar10;
    std::istream::ignore((long)&in);
    std::istream::ignore((long)&in);
    iVar3 = iVar3 + 3;
  }
  if ((int)pose.v[0]._0_4_ < (int)(uVar4 * 3)) {
    (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,(ulong)pose.v[0]._0_4_,0,0);
  }
  Mesh::recalculateNormals(this);
  std::
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  ::~set((set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
          *)&in_1);
  std::ifstream::close();
  std::ifstream::~ifstream(&in);
  return (Model *)this;
}

Assistant:

Model *loadSTL(const char *name, bool merge_double_vertices)
{
  Mesh *mesh=0;

  // open file

  std::ifstream in;

  in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
  in.open(name, std::ios_base::binary);

  // read header

  gmath::Matrix33d Rc;
  gmath::Vector3d Tc;
  bool has_campose=false;

  {
    char header[81];

    in.read(header, 80);
    header[80]='\0';

    std::string sheader(header);

    if (sheader.compare(0, 8, "campose=") == 0)
    {
      std::istringstream in(sheader.substr(8));

      gmath::Vector6d pose;
      in >> pose;

      if (in.good())
      {
        Rc=gmath::getRotation(pose);
        Tc=gmath::getTranslation(pose);
        has_campose=true;
      }
    }
  }

  // read number of trinagles

  uint32_t n;
  n=stlReadUint32(in);

  try
  {
    // create mesh

    mesh=new Mesh();

    if (has_campose)
    {
      mesh->setDefCameraRT(Rc, Tc);
    }

    mesh->resizeVertexList(3*n, false, false);
    mesh->resizeTriangleList(n);

    std::set<VertexNormalIndex> vni;

    // read all triangles

    int vn=0;

    for (uint32_t i=0; i<n; i++)
    {
      // read triangle normal

      gmath::Vector3f tnormal=stlReadVector3f(in);

      // read vertices and either find a duplicate or add them

      unsigned int t0, t1, t2;

      if (merge_double_vertices)
      {
        t0=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t1=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t2=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
      }
      else
      {
        t0=vn++;
        t1=vn++;
        t2=vn++;

        mesh->setVertex(t0, stlReadVector3f(in));
        mesh->setVertex(t1, stlReadVector3f(in));
        mesh->setVertex(t2, stlReadVector3f(in));
      }

      // store triangle indices

      mesh->setTriangleIndex(i, t0, t1, t2);

      // skip padding

      in.ignore(1);
      in.ignore(1);
    }

    // reduce list of vertices

    if (vn < static_cast<int>(3*n))
    {
      mesh->resizeVertexList(vn, false, false);
    }

    // calculate per vertex normals

    mesh->recalculateNormals();
  }
  catch (...)
  {
    delete mesh;
    throw;
  }

  in.close();

  return mesh;
}